

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O2

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
ChContactNSCrolling(ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                    *this,ChContactContainer *mcontainer,ChContactable_1vars<6> *mobjA,
                   ChContactable_1vars<6> *mobjB,ChCollisionInfo *cinfo,ChMaterialCompositeNSC *mat)

{
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::ChContactNSC
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             mcontainer,mobjA,mobjB,cinfo,mat);
  (this->super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
  super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>.
  _vptr_ChContactTuple = (_func_int **)&PTR__ChContactNSCrolling_0115f168;
  ChConstraintTwoTuplesRollingN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  ::ChConstraintTwoTuplesRollingN(&this->Rx);
  ChConstraintTwoTuplesRollingT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  ::ChConstraintTwoTuplesRollingT(&this->Ru);
  ChConstraintTwoTuplesRollingT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  ::ChConstraintTwoTuplesRollingT(&this->Rv);
  (this->react_torque).m_data[2] = 0.0;
  (this->react_torque).m_data[0] = 0.0;
  (this->react_torque).m_data[1] = 0.0;
  (this->Rx).constraint_U = &this->Ru;
  (this->Rx).constraint_V = &this->Rv;
  (this->Rx).constraint_N =
       &(this->super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
        Nx;
  (*(this->super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
    super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>.
    _vptr_ChContactTuple[0x10])(this,mobjA,mobjB,cinfo,mat);
  return;
}

Assistant:

ChContactNSCrolling(ChContactContainer* mcontainer,           ///< contact container
                        Ta* mobjA,                                ///< collidable object A
                        Tb* mobjB,                                ///< collidable object B
                        const collision::ChCollisionInfo& cinfo,  ///< data for the collision pair
                        const ChMaterialCompositeNSC& mat         ///< composite material
                        )
        : ChContactNSC<Ta, Tb>(mcontainer, mobjA, mobjB, cinfo, mat) {
        Rx.SetRollingConstraintU(&this->Ru);
        Rx.SetRollingConstraintV(&this->Rv);
        Rx.SetNormalConstraint(&this->Nx);

        Reset(mobjA, mobjB, cinfo, mat);
    }